

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::WaterTypeVisitor::visit(WaterTypeVisitor *this,RigidBody *rb)

{
  bool bVar1;
  iterator i_00;
  reference ppAVar2;
  element_type *this_00;
  long *in_RSI;
  AtomData *in_RDI;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::AtomData> atomData;
  iterator i;
  iterator atomIter;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> myAtoms;
  string rbName;
  RigidBody *in_stack_fffffffffffffe68;
  Atom *in_stack_fffffffffffffe70;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe78;
  StuntDouble *this_01;
  string *atomTypeName;
  WaterTypeVisitor *this_02;
  allocator<char> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  __shared_ptr local_130 [20];
  undefined4 local_11c;
  undefined1 local_101 [49];
  Atom **local_d0;
  Atom **local_c8;
  _Self local_a8;
  _Self local_a0 [3];
  string local_88;
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  local_58;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_50 [4];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x34f3ae);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(local_50);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  ::__normal_iterator(&local_58);
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34f3d5);
  (**(code **)(*(long *)local_10 + 0x38))(&local_88);
  this_02 = (WaterTypeVisitor *)&stack0xffffffffffffffd0;
  atomTypeName = &local_88;
  std::__cxx11::string::operator=((string *)this_02,(string *)atomTypeName);
  std::__cxx11::string::~string((string *)atomTypeName);
  i_00 = std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(in_stack_fffffffffffffe78,(key_type *)in_stack_fffffffffffffe70);
  local_a0[0]._M_node = i_00._M_node;
  local_a8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffe68);
  bVar1 = std::operator!=(local_a0,&local_a8);
  if (bVar1) {
    RigidBody::getAtoms(in_stack_fffffffffffffe68);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator=
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)atomTypeName,
               (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)in_stack_fffffffffffffe78)
    ;
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)atomTypeName);
    local_c8 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
                                  ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                   in_stack_fffffffffffffe68);
    local_50[0]._M_current = local_c8;
    while( true ) {
      local_d0 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
                                    ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                     in_stack_fffffffffffffe68);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                          *)in_stack_fffffffffffffe70,
                         (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                          *)in_stack_fffffffffffffe68);
      if (!bVar1) break;
      ppAVar2 = __gnu_cxx::
                __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                ::operator*(local_50);
      in_stack_fffffffffffffe70 = *ppAVar2;
      this_01 = (StuntDouble *)local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      StuntDouble::getPropertyByName(this_01,(string *)in_stack_fffffffffffffe70);
      std::__cxx11::string::~string((string *)(local_101 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_101);
      bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe70,
                              in_stack_fffffffffffffe68);
      if (bVar1) {
        std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
                  ((shared_ptr<OpenMD::GenericData> *)this_02);
        std::shared_ptr<OpenMD::AtomData>::operator=
                  ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe70,
                   (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe68);
        std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34f5ce);
        bVar1 = std::operator==((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe70,
                                in_stack_fffffffffffffe68);
        if (bVar1) {
          local_11c = 4;
        }
        else {
          std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x34f670);
          AtomData::beginAtomInfo(in_RDI,(iterator *)i_00._M_node);
          while (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_130), bVar1) {
            std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x34f6d1);
            trimmedName(this_02,atomTypeName);
            this_00 = std::
                      __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x34f6ef);
            std::__cxx11::string::operator=((string *)this_00,(string *)&stack0xfffffffffffffeb0);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
            std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x34f713);
            AtomData::nextAtomInfo(in_RDI,(iterator *)i_00._M_node);
            std::shared_ptr<OpenMD::AtomInfo>::operator=
                      ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe70,
                       (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe68);
            std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34f743)
            ;
          }
          local_11c = 5;
          std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34f6a9);
          local_11c = 0;
        }
      }
      else {
        local_11c = 4;
      }
      std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34f77d)
      ;
      __gnu_cxx::
      __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
      ::operator++(local_50);
    }
  }
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34f7bb);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)atomTypeName);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void WaterTypeVisitor::visit(RigidBody* rb) {
    std::string rbName;
    std::vector<Atom*> myAtoms;
    std::vector<Atom*>::iterator atomIter;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    std::shared_ptr<AtomData> atomData;

    rbName = rb->getType();

    if (waterTypeList.find(rbName) != waterTypeList.end()) {
      myAtoms = rb->getAtoms();

      for (atomIter = myAtoms.begin(); atomIter != myAtoms.end(); ++atomIter) {
        std::shared_ptr<GenericData> data =
            (*atomIter)->getPropertyByName("ATOMDATA");

        if (data != nullptr) {
          atomData = std::dynamic_pointer_cast<AtomData>(data);

          if (atomData == nullptr) continue;
        } else
          continue;

        for (std::shared_ptr<AtomInfo> atomInfo = atomData->beginAtomInfo(i);
             atomInfo; atomInfo                 = atomData->nextAtomInfo(i)) {
          atomInfo->atomTypeName = trimmedName(atomInfo->atomTypeName);
        }
      }
    }
  }